

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv_layer_t.h
# Opt level: O2

void __thiscall
conv_layer_t::conv_layer_t
          (conv_layer_t *this,uint16_t stride,uint16_t extend_filter,uint16_t number_filters,
          tdsize in_size)

{
  uint uVar1;
  uint uVar2;
  float *pfVar3;
  int iVar4;
  int z;
  uint _z;
  uint _z_00;
  char *__assertion;
  uint _z_01;
  int i;
  int _y;
  uint _x;
  int j;
  int _x_00;
  uint _y_00;
  int _x_01;
  bool bVar5;
  tensor_t<float> t;
  tensor_t<float> local_80;
  tensor_t<float> local_58;
  
  _z_01 = in_size.z;
  _z_00 = (uint)number_filters;
  _x_00 = in_size.x;
  _y = in_size.y;
  tensor_t<float>::tensor_t(&t,_x_00,_y,_z_01);
  tensor_t<float>::tensor_t(&local_58,_x_00,_y,_z_01);
  uVar1 = (uint)extend_filter;
  _x_01 = (int)(_x_00 - uVar1) / (int)(uint)stride + 1;
  iVar4 = (int)(_y - uVar1) / (int)(uint)stride + 1;
  tensor_t<float>::tensor_t(&local_80,_x_01,iVar4,_z_00);
  layer_t::layer_t(&this->super_layer_t,conv,&t,&local_58,&local_80);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&local_80);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&local_58);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&t);
  (this->filters).super__Vector_base<tensor_t<float>,_std::allocator<tensor_t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filter_grads).
  super__Vector_base<tensor_t<gradient_t>,_std::allocator<tensor_t<gradient_t>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filter_grads).
  super__Vector_base<tensor_t<gradient_t>,_std::allocator<tensor_t<gradient_t>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filter_grads).
  super__Vector_base<tensor_t<gradient_t>,_std::allocator<tensor_t<gradient_t>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filters).super__Vector_base<tensor_t<float>,_std::allocator<tensor_t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filters).super__Vector_base<tensor_t<float>,_std::allocator<tensor_t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filters).super__Vector_base<tensor_t<float>,_std::allocator<tensor_t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filter_grads).
  super__Vector_base<tensor_t<gradient_t>,_std::allocator<tensor_t<gradient_t>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->stride = stride;
  this->extend_filter = extend_filter;
  if ((float)(int)(_x_00 - uVar1) / (float)stride + 1.0 == (float)_x_01) {
    if ((float)(int)(_y - uVar1) / (float)stride + 1.0 == (float)iVar4) {
      uVar2 = 0;
      while( true ) {
        if (uVar2 == _z_00) break;
        tensor_t<float>::tensor_t(&t,uVar1,uVar1,_z_01);
        for (_x = 0; _x != uVar1; _x = _x + 1) {
          for (_y_00 = 0; _y_00 != uVar1; _y_00 = _y_00 + 1) {
            for (_z = 0; (~((int)_z_01 >> 0x1f) & _z_01) != _z; _z = _z + 1) {
              iVar4 = rand();
              pfVar3 = tensor_t<float>::get(&t,_x,_y_00,_z);
              *pfVar3 = (float)iVar4 * 4.656613e-10 * (1.0 / (float)(int)(uVar1 * _z_01 * uVar1));
            }
          }
        }
        std::vector<tensor_t<float>,_std::allocator<tensor_t<float>_>_>::push_back
                  (&this->filters,&t);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&t);
        uVar2 = uVar2 + 1;
      }
      while (bVar5 = _z_00 != 0, _z_00 = _z_00 - 1, bVar5) {
        tensor_t<gradient_t>::tensor_t((tensor_t<gradient_t> *)&t,uVar1,uVar1,_z_01);
        std::vector<tensor_t<gradient_t>,_std::allocator<tensor_t<gradient_t>_>_>::push_back
                  (&this->filter_grads,(value_type *)&t);
        std::_Vector_base<gradient_t,_std::allocator<gradient_t>_>::~_Vector_base
                  ((_Vector_base<gradient_t,_std::allocator<gradient_t>_> *)&t);
      }
      return;
    }
    __assertion = 
    "(float(in_size.y - extend_filter) / stride + 1) == ((in_size.y - extend_filter) / stride + 1)";
    uVar1 = 0x22;
  }
  else {
    __assertion = 
    "(float(in_size.x - extend_filter) / stride + 1) == ((in_size.x - extend_filter) / stride + 1)";
    uVar1 = 0x21;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/acstud[P]lab3-cnn/src/cnn/conv_layer_t.h"
                ,uVar1,"conv_layer_t::conv_layer_t(uint16_t, uint16_t, uint16_t, tdsize)");
}

Assistant:

conv_layer_t(uint16_t stride, uint16_t extend_filter, uint16_t number_filters, tdsize in_size) :
      layer_t(layer_type::conv,
              tensor_t<float>(in_size.x, in_size.y, in_size.z),
              tensor_t<float>(in_size.x, in_size.y, in_size.z),
              tensor_t<float>(
                  (in_size.x - extend_filter) / stride + 1,
                  (in_size.y - extend_filter) / stride + 1,
                  number_filters)
      ), stride(stride), extend_filter(extend_filter) {
    assert((float(in_size.x - extend_filter) / stride + 1) == ((in_size.x - extend_filter) / stride + 1));
    assert((float(in_size.y - extend_filter) / stride + 1) == ((in_size.y - extend_filter) / stride + 1));

    for (int a = 0; a < number_filters; a++) {
      tensor_t<float> t(extend_filter, extend_filter, in_size.z);

      int maxval = extend_filter * extend_filter * in_size.z;

      for (int i = 0; i < extend_filter; i++)
        for (int j = 0; j < extend_filter; j++)
          for (int z = 0; z < in_size.z; z++)
            t(i, j, z) = 1.0f / maxval * rand() / float(RAND_MAX);
      filters.push_back(t);
    }
    for (int i = 0; i < number_filters; i++) {
      tensor_t<gradient_t> t(extend_filter, extend_filter, in_size.z);
      filter_grads.push_back(t);
    }

  }